

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O1

string * __thiscall aeron::Counter::label_abi_cxx11_(string *__return_storage_ptr__,Counter *this)

{
  int iVar1;
  ClientConductor *pCVar2;
  uint8_t *puVar3;
  long lVar4;
  
  pCVar2 = this->m_clientConductor;
  iVar1 = (this->super_AtomicCounter).m_counterId;
  concurrent::CountersReader::validateCounterId(&pCVar2->m_countersReader,iVar1);
  lVar4 = (long)iVar1 * 0x200;
  puVar3 = (pCVar2->m_countersReader).m_metadataBuffer.m_buffer;
  iVar1 = *(int *)(puVar3 + lVar4 + 0x80);
  puVar3 = puVar3 + ((int)lVar4 + 0x84);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<unsigned_char*>
            ((string *)__return_storage_ptr__,puVar3,puVar3 + iVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Counter::label() const
{
    return m_clientConductor->countersReader().getCounterLabel(id());
}